

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_manager.c
# Opt level: O0

void generate_user_if_parameters(mm_context_t *context,uint8_t **buffer,size_t *len)

{
  dlog_mt_user_if_params_t *user_if_table;
  uint8_t *pbuffer;
  dlog_mt_user_if_params_t *puser_if_params;
  size_t *len_local;
  uint8_t **buffer_local;
  mm_context_t *context_local;
  
  *len = 0x44;
  user_if_table = (dlog_mt_user_if_params_t *)calloc(1,*len);
  if (user_if_table == (dlog_mt_user_if_params_t *)0x0) {
    fprintf(_stderr,"%s: Error allocating %zu bytes of memory\n","generate_user_if_parameters",*len)
    ;
    mm_shutdown(context);
    exit(-0xc);
  }
  printf("\nGenerating User Interface Parameters table:\n");
  user_if_table->id = '\x1e';
  user_if_table->digit_clear_delay = 0x1c2;
  user_if_table->transient_delay = 0x1c2;
  user_if_table->transient_hint_time = 0x1c2;
  user_if_table->visual_to_voice_delay = 0x1c2;
  user_if_table->voice_repitition_delay = 0x1c2;
  user_if_table->no_action_timeout = 3000;
  user_if_table->card_validation_timeout = 0x1194;
  user_if_table->dj_second_string_dtmf_timeout = 300;
  user_if_table->spare_timer_b = 0x44c;
  user_if_table->cp_input_timeout = 100;
  user_if_table->language_timeout = 1000;
  user_if_table->cfs_timeout = 200;
  user_if_table->called_party_disconnect = 0x4b0;
  user_if_table->no_voice_prompt_reps = '\x03';
  user_if_table->accs_digit_timeout = 0x1c2;
  user_if_table->collect_call_timeout = 400;
  user_if_table->bong_tone_timeout = 300;
  user_if_table->accs_no_action_timeout = 0x1c2;
  user_if_table->card_auth_required_timeout = 4000;
  user_if_table->rate_request_timeout = 6000;
  user_if_table->manual_dial_hold_time = 0x32;
  user_if_table->autodialer_hold_time = 300;
  user_if_table->coin_first_warning_time = 0x1e;
  user_if_table->coin_second_warning_time = 5;
  user_if_table->alternate_bong_tone_timeout = 200;
  user_if_table->delay_after_bong_tone = 0x7d;
  user_if_table->alternate_delay_after_bong_tone = 0x7d;
  user_if_table->display_scroll_speed = 0;
  user_if_table->aos_bong_tone_timeout = 600;
  user_if_table->fgb_aos_second_spill_timeout = 600;
  user_if_table->datajack_connect_timeout = 15000;
  user_if_table->datajack_pause_threshold = 0x2d;
  user_if_table->datajack_ias_timer = 10;
  *buffer = (uint8_t *)user_if_table;
  print_user_if_params_table(user_if_table);
  return;
}

Assistant:

static void generate_user_if_parameters(mm_context_t *context, uint8_t **buffer, size_t *len) {
    dlog_mt_user_if_params_t *puser_if_params;
    uint8_t *pbuffer;

    *len    = sizeof(dlog_mt_user_if_params_t);
    pbuffer = (uint8_t*)calloc(1, *len);

    if (pbuffer == NULL) {
        fprintf(stderr, "%s: Error allocating %zu bytes of memory\n", __func__, *len);
        mm_shutdown(context);
        exit(-ENOMEM);
    }

    puser_if_params = (dlog_mt_user_if_params_t *)pbuffer;

    printf("\nGenerating User Interface Parameters table:\n");
    puser_if_params->id = DLOG_MT_USER_IF_PARMS;
    puser_if_params->digit_clear_delay               = LE16(450);
    puser_if_params->transient_delay                 = LE16(450);
    puser_if_params->transient_hint_time             = LE16(450);
    puser_if_params->visual_to_voice_delay           = LE16(450);
    puser_if_params->voice_repitition_delay          = LE16(450);
    puser_if_params->no_action_timeout               = LE16(3000);
    puser_if_params->card_validation_timeout         = LE16(4500); /* Change from 30s to 45s */
    puser_if_params->dj_second_string_dtmf_timeout   = LE16(300);
    puser_if_params->spare_timer_b                   = LE16(1100);
    puser_if_params->cp_input_timeout                = LE16(100);
    puser_if_params->language_timeout                = LE16(1000);
    puser_if_params->cfs_timeout                     = LE16(200);
    puser_if_params->called_party_disconnect         = LE16(1200);
    puser_if_params->no_voice_prompt_reps            = 3;
    puser_if_params->accs_digit_timeout              = LE16(450);
    puser_if_params->collect_call_timeout            = LE16(400);
    puser_if_params->bong_tone_timeout               = LE16(300);
    puser_if_params->accs_no_action_timeout          = LE16(450);
    puser_if_params->card_auth_required_timeout      = LE16(4000);
    puser_if_params->rate_request_timeout            = LE16(6000);
    puser_if_params->manual_dial_hold_time           = LE16(50);
    puser_if_params->autodialer_hold_time            = LE16(300);
    puser_if_params->coin_first_warning_time         = LE16(30);
    puser_if_params->coin_second_warning_time        = LE16(5);
    puser_if_params->alternate_bong_tone_timeout     = LE16(200);
    puser_if_params->delay_after_bong_tone           = LE16(125);
    puser_if_params->alternate_delay_after_bong_tone = LE16(125);
    puser_if_params->display_scroll_speed            = LE16(0);
    puser_if_params->aos_bong_tone_timeout           = LE16(600);
    puser_if_params->fgb_aos_second_spill_timeout    = LE16(600);
    puser_if_params->datajack_connect_timeout        = LE16(15000);
    puser_if_params->datajack_pause_threshold        = LE16(45);
    puser_if_params->datajack_ias_timer              = LE16(10);
    *buffer                                          = pbuffer;

    print_user_if_params_table(puser_if_params);

}